

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glew.c
# Opt level: O0

GLubyte * glewGetErrorString(GLenum error)

{
  ulong local_20;
  size_t max_error;
  GLenum error_local;
  
  if (error < 5) {
    local_20 = (ulong)error;
  }
  else {
    local_20 = 4;
  }
  return glewGetErrorString::_glewErrorString[local_20];
}

Assistant:

const GLubyte * GLEWAPIENTRY glewGetErrorString (GLenum error)
{
  static const GLubyte* _glewErrorString[] =
  {
    (const GLubyte*)"No error",
    (const GLubyte*)"Missing GL version",
    (const GLubyte*)"GL 1.1 and up are not supported",
    (const GLubyte*)"GLX 1.2 and up are not supported",
    (const GLubyte*)"Unknown error"
  };
  const size_t max_error = sizeof(_glewErrorString)/sizeof(*_glewErrorString) - 1;
  return _glewErrorString[(size_t)error > max_error ? max_error : (size_t)error];
}